

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1EnforceMaxPage(PCache1 *pCache)

{
  PGroup *pPVar1;
  bool bVar2;
  PgHdr1 *local_20;
  PgHdr1 *p;
  PGroup *pGroup;
  PCache1 *pCache_local;
  
  pPVar1 = pCache->pGroup;
  while( true ) {
    bVar2 = false;
    if (pPVar1->nMaxPage < pPVar1->nCurrentPage) {
      local_20 = (pPVar1->lru).pLruPrev;
      bVar2 = local_20->isAnchor == '\0';
    }
    if (!bVar2) break;
    pcache1PinPage(local_20);
    pcache1RemoveFromHash(local_20,1);
  }
  if ((pCache->nPage == 0) && (pCache->pBulk != (void *)0x0)) {
    sqlite3_free(pCache->pBulk);
    pCache->pFree = (PgHdr1 *)0x0;
    pCache->pBulk = (void *)0x0;
  }
  return;
}

Assistant:

static void pcache1EnforceMaxPage(PCache1 *pCache){
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *p;
  assert( sqlite3_mutex_held(pGroup->mutex) );
  while( pGroup->nCurrentPage>pGroup->nMaxPage
      && (p=pGroup->lru.pLruPrev)->isAnchor==0
  ){
    assert( p->pCache->pGroup==pGroup );
    assert( p->isPinned==0 );
    pcache1PinPage(p);
    pcache1RemoveFromHash(p, 1);
  }
  if( pCache->nPage==0 && pCache->pBulk ){
    sqlite3_free(pCache->pBulk);
    pCache->pBulk = pCache->pFree = 0;
  }
}